

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wordset.cpp
# Opt level: O1

void __thiscall wordset::create_inserts(wordset *this,string *word)

{
  pointer pcVar1;
  long lVar2;
  long lVar3;
  size_type __pos;
  ulong uVar4;
  string temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (word->_M_string_length != 0) {
    uVar4 = 0;
    do {
      lVar2 = DAT_001091a0;
      if (DAT_001091a0 != 0) {
        lVar3 = 0;
        do {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          pcVar1 = (word->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,pcVar1,pcVar1 + word->_M_string_length);
          std::__cxx11::string::_M_replace_aux((ulong)&local_50,uVar4,0,'\x01');
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&this->edits,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          lVar3 = lVar3 + 1;
        } while (lVar2 != lVar3);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < word->_M_string_length);
  }
  return;
}

Assistant:

void wordset::create_inserts(const string &word) {
    for (int i = 0; i < word.length(); ++i) {
        for (char c : alphabet) {
            string temp = word;
            temp.insert(temp.begin()+i, c);
            edits.insert(temp);
        }
    }
}